

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

void __thiscall SkylineBinPack::MergeSkylines(SkylineBinPack *this)

{
  SkylineNode *pSVar1;
  uint index;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    index = (uint)uVar2 + 1;
    uVar3 = (ulong)index;
    while( true ) {
      if ((this->skyLine).Count - 1 <= (uint)uVar2) {
        return;
      }
      pSVar1 = (this->skyLine).Array;
      if (pSVar1[uVar2].y != pSVar1[uVar3].y) break;
      pSVar1[uVar2].width = pSVar1[uVar2].width + pSVar1[uVar3].width;
      TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Delete(&this->skyLine,index)
      ;
    }
  } while( true );
}

Assistant:

void SkylineBinPack::MergeSkylines()
{
	for(unsigned i = 0; i < skyLine.Size()-1; ++i)
		if (skyLine[i].y == skyLine[i+1].y)
		{
			skyLine[i].width += skyLine[i+1].width;
			skyLine.Delete(i+1);
			--i;
		}
}